

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Simplex_Mesh.h
# Opt level: O2

uint __thiscall Nova::Simplex_Mesh<3>::Add_Element(Simplex_Mesh<3> *this,INDEX *e)

{
  std::vector<Nova::Vector<int,_3,_true>,_std::allocator<Nova::Vector<int,_3,_true>_>_>::push_back
            (&(this->elements)._data,e);
  return (uint)(((long)(this->elements)._data.
                       super__Vector_base<Nova::Vector<int,_3,_true>,_std::allocator<Nova::Vector<int,_3,_true>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                (long)(this->elements)._data.
                      super__Vector_base<Nova::Vector<int,_3,_true>,_std::allocator<Nova::Vector<int,_3,_true>_>_>
                      ._M_impl.super__Vector_impl_data._M_start) / 0xc);
}

Assistant:

unsigned Add_Element(const INDEX& e)
    {
        elements.Append(e);
        return elements.size();
    }